

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_encoding.c
# Opt level: O1

int from_base_64(int c)

{
  int iVar1;
  
  if (c - 0x41U < 0x1a) {
    return c - 0x41U;
  }
  if (c - 0x61U < 0x1a) {
    iVar1 = c + -0x47;
  }
  else {
    if (9 < c - 0x30U) {
      if (c == 0x2b) {
        return 0x3e;
      }
      if (c != 0x3d) {
        if (c == 0x2f) {
          return 0x3f;
        }
        return 0x16;
      }
      return 0;
    }
    iVar1 = c + 4;
  }
  return iVar1;
}

Assistant:

static int from_base_64(int c)
{
    if ('A' <= c && c <= 'Z')
    {
        return c - 'A';
    }
    else if ('a' <= c && c <= 'z')
    {
        return (c - 'a') + 26;
    }
    else if ('0' <= c && c <= '9')
    {
        return (c - '0') + 52;
    }
    else if ('+' == c)
    {
        return 62;
    }
    else if ('/' == c)
    {
        return 63;
    }
    else if ('=' == c)
    {
        return 0;
    }

    return EINVAL;
}